

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<int,_false,_6> __thiscall
immutable::vector<int,_false,_6>::erase
          (vector<int,_false,_6> *this,size_type_conflict from,size_type_conflict to)

{
  rrb<int,_false,_6> *prVar1;
  uint in_ECX;
  undefined4 in_register_00000034;
  vector<int,_false,_6> local_30;
  vector<int,_false,_6> local_28;
  
  if (to < in_ECX) {
    take(&local_28,from);
    drop(&local_30,from);
    operator+((immutable *)this,&local_28,&local_30);
  }
  else {
    prVar1 = *(rrb<int,_false,_6> **)CONCAT44(in_register_00000034,from);
    (this->_impl).ptr = prVar1;
    if (prVar1 != (rrb<int,_false,_6> *)0x0) {
      prVar1->_ref_count = prVar1->_ref_count + 1;
    }
  }
  if (to < in_ECX) {
    ref<immutable::rrb<int,_false,_6>_>::~ref(&local_30._impl);
    ref<immutable::rrb<int,_false,_6>_>::~ref(&local_28._impl);
  }
  return (vector<int,_false,_6>)(ref<immutable::rrb<int,_false,_6>_>)this;
}

Assistant:

vector erase(size_type from, size_type to) const
        {
        return to > from ? take(from) + drop(to) : *this;
        }